

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPixmapCache::Key>::copyAppend
          (QGenericArrayOps<QPixmapCache::Key> *this,Key *b,Key *e)

{
  qsizetype *pqVar1;
  Key *pKVar2;
  
  if (b != e) {
    pKVar2 = (this->super_QArrayDataPointer<QPixmapCache::Key>).ptr;
    for (; b < e; b = b + 1) {
      QPixmapCache::Key::Key(pKVar2 + (this->super_QArrayDataPointer<QPixmapCache::Key>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QPixmapCache::Key>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }